

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

size_t getendpos(lua_State *L,int arg,lua_Integer def,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  
  sVar1 = luaL_optinteger(L,3,CONCAT44(in_register_00000034,arg));
  sVar2 = def;
  if (((long)sVar1 <= def) && (sVar2 = sVar1, (long)sVar1 < 0)) {
    if (SBORROW8(sVar1,-def) == (long)(sVar1 + def) < 0) {
      sVar2 = def + 1 + sVar1;
    }
    else {
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

static size_t getendpos (lua_State *L, int arg, lua_Integer def,
                         size_t len) {
  lua_Integer pos = luaL_optinteger(L, arg, def);
  if (pos > (lua_Integer)len)
    return len;
  else if (pos >= 0)
    return (size_t)pos;
  else if (pos < -(lua_Integer)len)
    return 0;
  else return len + (size_t)pos + 1;
}